

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_codegen.c
# Opt level: O0

void visit_identifier_expr(gvisitor_t *self,gnode_identifier_expr_t *node)

{
  ushort uVar1;
  ushort uVar2;
  gnode_location_type gVar3;
  gravity_function_t *f;
  ircode_t *code_00;
  char *s;
  gupvalue_t *pgVar4;
  gravity_vm *pgVar5;
  byte bVar6;
  uint16_t uVar7;
  uint32_t uVar8;
  gravity_value_t gVar9;
  uint32_t local_1ac;
  uint32_t local_190;
  uint32_t local_18c;
  uint32_t local_174;
  uint32_t local_14c;
  uint32_t local_134;
  uint32_t local_11c;
  uint32_t local_104;
  uint32_t local_ec;
  uint32_t local_c4;
  uint32_t temp_1;
  uint32_t local_8c;
  uint16_t kindex_1;
  uint32_t index_register;
  uint32_t temp;
  uint16_t i;
  uint32_t target;
  uint32_t dest;
  _Bool is_ivar;
  uint32_t reg_2;
  gupvalue_t *upvalue;
  uint32_t reg_1;
  uint16_t kindex;
  uint32_t reg;
  uint16_t nup;
  uint16_t index;
  gnode_location_type type;
  char *identifier;
  _Bool is_assignment;
  ircode_t *code;
  gravity_function_t *context_function;
  gravity_object_t *context_object;
  gnode_identifier_expr_t *node_local;
  gvisitor_t *self_local;
  
  f = *(gravity_function_t **)(*(long *)((long)self->data + 0x10) + (*self->data + -1) * 8);
  if ((f == (gravity_function_t *)0x0) || (f->isa != gravity_class_function)) {
    report_error(self,&node->base,"Invalid code context.");
  }
  else {
    code_00 = *(ircode_t **)((long)&f->field_9 + 0x50);
    bVar6 = (node->base).is_assignment & 1;
    s = node->value;
    gVar3 = (node->location).type;
    uVar1 = (node->location).index;
    uVar2 = (node->location).nup;
    switch(gVar3) {
    case LOCATION_LOCAL:
      if (bVar6 == 0) {
        ircode_register_push(code_00,(uint)uVar1);
      }
      else {
        uVar8 = ircode_register_pop(code_00);
        if (uVar8 == 0xffffffff) {
          report_error(self,&node->base,"Invalid identifier expression.");
        }
        if (node == (gnode_identifier_expr_t *)0x0) {
          local_c4 = 0;
        }
        else {
          local_c4 = (node->base).token.lineno;
        }
        ircode_add(code_00,MOVE,(uint)uVar1,uVar8,0,local_c4);
      }
      break;
    case LOCATION_GLOBAL:
      pgVar5 = *(gravity_vm **)((long)self->data + 0x38);
      gVar9 = gravity_string_to_value((gravity_vm *)0x0,s,0xffffffff);
      uVar7 = gravity_function_cpool_add(pgVar5,f,gVar9);
      if (bVar6 == 0) {
        uVar8 = ircode_register_push_temp(code_00);
        if (node == (gnode_identifier_expr_t *)0x0) {
          local_104 = 0;
        }
        else {
          local_104 = (node->base).token.lineno;
        }
        ircode_add(code_00,LOADG,uVar8,(uint)uVar7,0,local_104);
      }
      else {
        uVar8 = ircode_register_pop(code_00);
        if (uVar8 == 0xffffffff) {
          report_error(self,&node->base,"Invalid identifier expression.");
        }
        if (node == (gnode_identifier_expr_t *)0x0) {
          local_ec = 0;
        }
        else {
          local_ec = (node->base).token.lineno;
        }
        ircode_add(code_00,STOREG,uVar8,(uint)uVar7,0,local_ec);
      }
      break;
    case LOCATION_UPVALUE:
      pgVar4 = node->upvalue;
      if (bVar6 == 0) {
        uVar8 = ircode_register_push_temp(code_00);
        if (node == (gnode_identifier_expr_t *)0x0) {
          local_134 = 0;
        }
        else {
          local_134 = (node->base).token.lineno;
        }
        ircode_add(code_00,LOADU,uVar8,pgVar4->selfindex,0,local_134);
      }
      else {
        uVar8 = ircode_register_pop(code_00);
        if (uVar8 == 0xffffffff) {
          report_error(self,&node->base,"Invalid identifier expression.");
        }
        if (node == (gnode_identifier_expr_t *)0x0) {
          local_11c = 0;
        }
        else {
          local_11c = (node->base).token.lineno;
        }
        ircode_add(code_00,STOREU,uVar8,pgVar4->selfindex,0,local_11c);
      }
      break;
    case LOCATION_CLASS_IVAR_SAME:
    case LOCATION_CLASS_IVAR_OUTER:
      temp = 0;
      if (gVar3 == LOCATION_CLASS_IVAR_OUTER) {
        uVar8 = ircode_register_push_temp(code_00);
        for (index_register._2_2_ = 0; index_register._2_2_ < uVar2;
            index_register._2_2_ = index_register._2_2_ + 1) {
          if (node == (gnode_identifier_expr_t *)0x0) {
            local_14c = 0;
          }
          else {
            local_14c = (node->base).token.lineno;
          }
          ircode_add(code_00,LOAD,uVar8,temp,0x100,local_14c);
          temp = uVar8;
        }
        if ((bVar6 != 0) && (uVar8 = ircode_register_pop(code_00), uVar8 == 0xffffffff)) {
          fprintf(_stderr,"[%s:%d] Assert failed in %s(): %s\n",
                  "/workspace/llm4binary/github/license_c_cmakelists/marcobambini[P]gravity/src/compiler/gravity_codegen.c"
                  ,0x773,"visit_identifier_expr","Unexpected register error.");
          abort();
        }
      }
      if (uVar1 == 0xffff) {
        pgVar5 = *(gravity_vm **)((long)self->data + 0x38);
        gVar9 = gravity_string_to_value((gravity_vm *)0x0,s,0xffffffff);
        uVar7 = gravity_function_cpool_add(pgVar5,f,gVar9);
        local_8c = ircode_register_push_temp(code_00);
        if (node == (gnode_identifier_expr_t *)0x0) {
          local_174 = 0;
        }
        else {
          local_174 = (node->base).token.lineno;
        }
        ircode_add(code_00,LOADK,local_8c,(uint)uVar7,0,local_174);
        uVar8 = ircode_register_pop(code_00);
        if (uVar8 == 0xffffffff) {
          fprintf(_stderr,"[%s:%d] Assert failed in %s(): %s\n",
                  "/workspace/llm4binary/github/license_c_cmakelists/marcobambini[P]gravity/src/compiler/gravity_codegen.c"
                  ,0x783,"visit_identifier_expr","Unexpected register error.");
          abort();
        }
      }
      else {
        local_8c = uVar1 + 0x100;
      }
      if (bVar6 == 0) {
        if (gVar3 == LOCATION_CLASS_IVAR_OUTER) {
          local_190 = temp;
        }
        else {
          local_190 = ircode_register_push_temp(code_00);
        }
        if (node == (gnode_identifier_expr_t *)0x0) {
          local_1ac = 0;
        }
        else {
          local_1ac = (node->base).token.lineno;
        }
        ircode_add(code_00,LOAD,local_190,temp,local_8c,local_1ac);
      }
      else {
        uVar8 = ircode_register_pop(code_00);
        if (uVar8 == 0xffffffff) {
          report_error(self,&node->base,"Invalid identifier expression.");
        }
        if (node == (gnode_identifier_expr_t *)0x0) {
          local_18c = 0;
        }
        else {
          local_18c = (node->base).token.lineno;
        }
        ircode_add(code_00,STORE,uVar8,temp,local_8c,local_18c);
      }
    }
  }
  return;
}

Assistant:

static void visit_identifier_expr (gvisitor_t *self, gnode_identifier_expr_t *node) {
    DEBUG_CODEGEN("visit_identifier_expr %s", node->value);
    DECLARE_CODE();

    CODEGEN_COUNT_REGISTERS(n1);

    // check if the node is a left expression of an assignment
    bool is_assignment = node->base.is_assignment;

    const char            *identifier = node->value;        // identifier as c string
    gnode_location_type    type = node->location.type;        // location type
    uint16_t            index = node->location.index;    // symbol index
    uint16_t            nup = node->location.nup;        // upvalue index or outer index

    switch (type) {

        // local variable
        case LOCATION_LOCAL: {
            if (is_assignment) {
                uint32_t reg = ircode_register_pop(code);
                if (reg == REGISTER_ERROR) report_error(self, (gnode_t *)node, "Invalid identifier expression.");
				ircode_add(code, MOVE, index, reg, 0, LINE_NUMBER(node));
            } else {
                ircode_register_push(code, index);
            }
        } break;

        // module (global) variable
        case LOCATION_GLOBAL: {
            uint16_t kindex = gravity_function_cpool_add(GET_VM(), context_function, VALUE_FROM_CSTRING(NULL, identifier));
            if (is_assignment) {
                uint32_t reg = ircode_register_pop(code);
                if (reg == REGISTER_ERROR) report_error(self, (gnode_t *)node, "Invalid identifier expression.");
				ircode_add(code, STOREG, reg, kindex, 0, LINE_NUMBER(node));
            } else {
				ircode_add(code, LOADG, ircode_register_push_temp(code), kindex, 0, LINE_NUMBER(node));
            }
        } break;

        // upvalue access
        case LOCATION_UPVALUE: {
            gupvalue_t *upvalue = node->upvalue;
            if (is_assignment) {
                uint32_t reg = ircode_register_pop(code);
                if (reg == REGISTER_ERROR) report_error(self, (gnode_t *)node, "Invalid identifier expression.");
				ircode_add(code, STOREU, reg, upvalue->selfindex, 0, LINE_NUMBER(node));
            } else {
				ircode_add(code, LOADU, ircode_register_push_temp(code), upvalue->selfindex, 0, LINE_NUMBER(node));
            }
        } break;

        // class ivar case (outer case just need a loop lookup before)
        case LOCATION_CLASS_IVAR_OUTER:
        case LOCATION_CLASS_IVAR_SAME: {
            // needs to differentiate ivar (indexed by an integer) from other cases (indexed by a string)
            bool        is_ivar = (index != UINT16_MAX);
            uint32_t    dest = 0;
            uint32_t    target = 0;

            if (type == LOCATION_CLASS_IVAR_OUTER) {
                dest = ircode_register_push_temp(code);
                for (uint16_t i=0; i<nup; ++i) {
					ircode_add(code, LOAD, dest, target, 0 + MAX_REGISTERS, LINE_NUMBER(node));
                    target = dest;
                }
                if (is_assignment) {
                    uint32_t temp = ircode_register_pop(code);
                    DEBUG_ASSERT(temp != REGISTER_ERROR, "Unexpected register error.");
                }
            }

            uint32_t index_register;
            if (is_ivar) {
                // ivar case, use an index to load/retrieve it
                index_register = index + MAX_REGISTERS;
            } else {
                // not an ivar so it could be another class declaration like a func, a class or an enum
                // use lookup in order to retrieve it (assignment is handled here so you can change a
                // first class citizen at runtime too)
                uint16_t kindex = gravity_function_cpool_add(GET_VM(), context_function, VALUE_FROM_CSTRING(NULL, identifier));
                index_register = ircode_register_push_temp(code);
				ircode_add(code, LOADK, index_register, kindex, 0, LINE_NUMBER(node));
                uint32_t temp = ircode_register_pop(code);
                DEBUG_ASSERT(temp != REGISTER_ERROR, "Unexpected register error.");
            }

            if (is_assignment) {
                // should be prohibited by semantic to store something into a non ivar slot?
                dest = ircode_register_pop(code); // consume temp register
                if (dest == REGISTER_ERROR) report_error(self, (gnode_t *)node, "Invalid identifier expression.");
				ircode_add(code, STORE, dest, target, index_register, LINE_NUMBER(node));
            } else {
                dest = (type == LOCATION_CLASS_IVAR_OUTER) ? target : ircode_register_push_temp(code);
				ircode_add(code, LOAD, dest , target, index_register, LINE_NUMBER(node));
            }
        } break;
    }

    CODEGEN_COUNT_REGISTERS(n2);
    CODEGEN_ASSERT_REGISTERS(n1, n2, (is_assignment) ? -1 : 1);
}